

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianContIntDamping
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  undefined1 auVar1 [16];
  Index IVar2;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar3;
  XprTypeNested pMVar4;
  double *pdVar5;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ChVariables **ppCVar8;
  ChElementShellANCF_3443 *pCVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  PointerType pdVar12;
  undefined8 uVar13;
  XprTypeNested pMVar14;
  variable_if_dynamic<long,__1> vVar15;
  variable_if_dynamic<long,__1> vVar16;
  undefined1 auVar17 [32];
  long lVar18;
  Scalar *pSVar19;
  long startCol;
  long lVar20;
  long lVar21;
  ChElementShellANCF_3443 *this_00;
  int i;
  long lVar22;
  Matrix<double,__1,__1,_1,__1,__1> *xpr;
  int i_2;
  element_type *peVar23;
  Scalar SVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  ChMatrixNM<double,_6,_6> D;
  VectorNIP E_BlockDamping;
  VectorNIP E1_Block;
  VectorNIP E3_Block;
  VectorNIP E2_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP E4_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict3 S_scaled_SD;
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_1_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  MatrixNx6 ebar_ebardot;
  Index local_6470;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_6450;
  double local_6430;
  Index local_6428;
  Matrix<double,__1,__1,_0,__1,__1> *local_6420;
  Matrix<double,__1,__1,_1,__1,__1> *local_6418;
  Matrix<double,__1,__1,_1,__1,__1> *local_6410;
  XprTypeNested local_6408;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_6400;
  double *local_63e8;
  XprTypeNested local_63e0;
  Matrix<double,__1,__1,_1,__1,__1> *local_63d8;
  Matrix<double,__1,__1,_1,__1,__1> *local_63d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_63c8;
  ChVariables **local_63c0;
  element_type *local_63b8;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> local_63b0;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_6380;
  undefined8 *local_6368;
  ChVariables **local_6360;
  Matrix<double,__1,__1,_1,__1,__1> *local_6358;
  Matrix<double,__1,__1,_1,__1,__1> *local_6350;
  ChVariables **local_6348;
  Matrix<double,__1,__1,_1,__1,__1> *local_6340;
  Matrix<double,__1,__1,_1,__1,__1> *local_6338;
  XprTypeNested local_6330;
  double local_6328;
  ChMatrixNM<double,_6,_6> local_6320;
  undefined1 local_6200 [16];
  LhsNested LStack_61f0;
  variable_if_dynamic<long,__1> vStack_61e8;
  variable_if_dynamic<long,__1> vStack_61e0;
  element_type *peStack_61d8;
  scalar_constant_op<double> sStack_61d0;
  variable_if_dynamic<long,__1> vStack_61c8;
  element_type *peStack_61c0;
  LhsNested local_61b0;
  scalar_constant_op<double> sStack_61a8;
  element_type *peStack_61a0;
  element_type *peStack_6198;
  variable_if_dynamic<long,__1> vStack_6190;
  variable_if_dynamic<long,__1> vStack_6188;
  scalar_constant_op<double> sStack_6180;
  LhsNested local_6168;
  undefined8 auStack_6160 [40];
  undefined1 local_6020 [16];
  scalar_constant_op<double> sStack_6010;
  variable_if_dynamic<long,__1> vStack_6008;
  variable_if_dynamic<long,__1> vStack_6000;
  element_type *peStack_5ff8;
  double local_5fe0;
  RhsNested local_5fd8;
  double *local_5fc0;
  double *local_5fb8;
  double *local_5fb0;
  double *local_5fa8;
  ChElementShellANCF_3443 *local_5fa0;
  long local_5f98;
  long local_5f90;
  Matrix<double,__1,__1,_1,__1,__1> *local_5f88;
  undefined1 local_5f80 [16];
  scalar_constant_op<double> sStack_5f70;
  variable_if_dynamic<long,__1> vStack_5f68;
  variable_if_dynamic<long,__1> vStack_5f60;
  scalar_constant_op<double> sStack_5f58;
  variable_if_dynamic<long,__1> vStack_5f50;
  variable_if_dynamic<long,__1> vStack_5f48;
  element_type *peStack_5f40;
  undefined8 *local_5e00;
  double local_5df8;
  Matrix<double,__1,__1,_1,__1,__1> *local_5df0;
  undefined1 local_5de8 [16];
  scalar_constant_op<double> sStack_5dd8;
  variable_if_dynamic<long,__1> vStack_5dd0;
  scalar_constant_op<double> sStack_5dc8;
  element_type *peStack_5dc0;
  element_type *local_5da8;
  scalar_constant_op<double> local_5da0;
  Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false> local_5d50;
  undefined1 local_5d20 [16];
  scalar_constant_op<double> sStack_5d10;
  variable_if_dynamic<long,__1> vStack_5d08;
  scalar_constant_op<double> sStack_5d00;
  scalar_constant_op<double> sStack_5cf8;
  variable_if_dynamic<long,__1> vStack_5cf0;
  variable_if_dynamic<long,__1> vStack_5ce8;
  element_type *peStack_5ce0;
  scalar_constant_op<double> local_5cd8;
  undefined1 local_5c40 [24];
  variable_if_dynamic<long,__1> local_5c28;
  variable_if_dynamic<long,__1> local_5c20;
  PointerType local_5c18;
  double dStack_5c10;
  XprTypeNested pMStack_5c08;
  double dStack_5c00;
  double dStack_5bf8;
  double dStack_5bf0;
  double local_5bd0;
  PointerType pdStack_5bc8;
  double dStack_5bc0;
  XprTypeNested local_5bb8;
  double dStack_5bb0;
  double dStack_5ba8;
  RhsNested pMStack_5ba0;
  double local_5b78;
  undefined8 local_5b70 [9];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_5b28;
  undefined1 local_5b00 [24];
  PointerType local_5ae8;
  double dStack_5ae0;
  XprTypeNested pMStack_5ad8;
  variable_if_dynamic<long,__1> vStack_5ad0;
  variable_if_dynamic<long,__1> vStack_5ac8;
  RhsNested pMStack_5ac0;
  undefined1 local_5a00 [24];
  PointerType local_59e8;
  double dStack_59e0;
  XprTypeNested pMStack_59d8;
  variable_if_dynamic<long,__1> vStack_59d0;
  variable_if_dynamic<long,__1> vStack_59c8;
  double dStack_59c0;
  Matrix<double,_32,_1,_0,_32,_1> local_5900;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
  local_5800 [3];
  Matrix<double,_32,_1,_0,_32,_1> local_5700;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_55e8;
  Matrix<double,_32,_1,_0,_32,_1> local_55c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
  local_54c0 [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
  local_53c0 [3];
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_52a0;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_5298;
  element_type *local_5290;
  element_type *peStack_5288;
  element_type *peStack_5280;
  element_type *peStack_5278;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_5260;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_5258;
  element_type *local_5250;
  element_type *peStack_5248;
  element_type *peStack_5240;
  element_type *peStack_5238;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_5220;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_5218;
  element_type *local_5210;
  element_type *peStack_5208;
  element_type *peStack_5200;
  element_type *peStack_51f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_51e8;
  undefined1 local_51c0 [16];
  scalar_constant_op<double> sStack_51b0;
  variable_if_dynamic<long,__1> vStack_51a8;
  undefined1 auStack_51a0 [16];
  element_type *peStack_5190;
  scalar_constant_op<double> sStack_5188;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *pDStack_5180;
  variable_if_dynamic<long,__1> vStack_5178;
  variable_if_dynamic<long,__1> vStack_5170;
  variable_if_dynamic<long,__1> local_5168;
  scalar_constant_op<double> sStack_5160;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_5158;
  element_type *local_5150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5148;
  element_type *local_5140;
  scalar_constant_op<double> sStack_5138;
  scalar_constant_op<double> sStack_5130;
  element_type *peStack_5128;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_5120;
  variable_if_dynamic<long,__1> local_5118;
  variable_if_dynamic<long,__1> local_5110;
  variable_if_dynamic<long,__1> local_5108;
  scalar_constant_op<double> local_5100;
  RhsNested local_50f8;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_50f0;
  double local_50e8;
  scalar_constant_op<double> local_50e0;
  Matrix<double,__1,__1,_1,__1,__1> *local_50d8;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_50c8;
  variable_if_dynamic<long,__1> local_50c0;
  variable_if_dynamic<long,__1> local_50b8;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_50b0;
  Matrix<double,__1,__1,_1,__1,__1> *local_50a8;
  scalar_constant_op<double> local_50a0;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_5098;
  undefined1 *local_5090;
  scalar_constant_op<double> local_5088;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_5080;
  double local_5078;
  XprTypeNested local_5070;
  variable_if_dynamic<long,__1> local_5068;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_5050;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_5040;
  double local_5038;
  scalar_constant_op<double> sStack_5030;
  PointerType local_5028;
  undefined1 *local_5020;
  variable_if_dynamic<long,__1> local_5010;
  variable_if_dynamic<long,__1> local_5008;
  double local_5000;
  double local_4ff8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4fe0;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_4fd0;
  double local_4fc8;
  XprTypeNested local_4fc0;
  variable_if_dynamic<long,__1> local_4fb8;
  variable_if_dynamic<long,__1> local_4fb0;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_4fa0;
  double local_4f98;
  double local_4f90;
  double local_4f88;
  Matrix<double,__1,__1,_1,__1,__1> *local_4f70;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_4f60;
  double local_4f58;
  double local_4f50;
  double local_4f48;
  undefined1 *local_4f40;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_4f30;
  double local_4f28;
  double local_4f20;
  double local_4f18;
  undefined1 local_21c0 [32];
  scalar_constant_op<double> local_21a0;
  RhsNested local_2180;
  scalar_constant_op<double> local_2178;
  Matrix<double,_32,_1,_0,_32,_1> local_20c0;
  Matrix<double,_32,_1,_0,_32,_1> local_1fc0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_1ea8;
  undefined1 local_1e80 [512];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1c80 [10];
  ChVariables *apCStack_1b80 [32];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1a80 [10];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1980 [10];
  ChVariables *apCStack_1880 [32];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1780 [10];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1680 [10];
  undefined1 local_1580 [512];
  undefined1 local_1380 [512];
  Matrix<double,__1,__1,_1,__1,__1> local_1180 [10];
  Matrix<double,__1,__1,_1,__1,__1> local_1080 [10];
  ChVariables *local_f80 [32];
  Matrix<double,__1,__1,_1,__1,__1> local_e80 [10];
  Matrix<double,__1,__1,_1,__1,__1> local_d80 [10];
  undefined1 local_c80 [512];
  undefined1 local_a80 [2640];
  
  local_6328 = Kfactor;
  local_5df8 = Rfactor;
  CalcCombinedCoordMatrix(this,(MatrixNx6 *)(local_a80 + 0x700));
  Eigen::
  DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)H);
  xpr = &this->m_SD;
  local_63c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1380 + 0x100);
  local_6348 = apCStack_1b80;
  local_63e0 = (XprTypeNested)local_1380;
  local_5df0 = aMStack_1c80;
  local_6418 = local_e80;
  local_6358 = aMStack_1780;
  local_63d0 = local_1180;
  local_6340 = aMStack_1a80;
  local_6410 = local_d80;
  local_6350 = aMStack_1680;
  local_63d8 = local_1080;
  local_6338 = aMStack_1980;
  local_63e8 = &this->m_Alpha;
  local_63c0 = local_f80;
  local_6360 = apCStack_1880;
  local_5e00 = local_5b70;
  local_5fb0 = local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x1a;
  local_6408 = (XprTypeNested)(local_1580 + 0x100);
  local_6330 = (XprTypeNested)(local_1e80 + 0x100);
  local_5fc0 = local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x20;
  local_5fa8 = local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x14;
  local_6368 = auStack_6160;
  local_6420 = &this->m_kGQ;
  lVar21 = 0;
  local_5fb8 = &local_5038;
  local_63b8 = (element_type *)H;
  local_5fa0 = this;
  local_5f88 = xpr;
  while( true ) {
    peVar23 = local_63b8;
    if (local_5fa0->m_numLayers <= lVar21) break;
    startCol = lVar21 * 0x60;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_16,_96,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false> *)local_1e80,xpr,0,
               startCol);
    auVar17 = _auStack_51a0;
    auStack_51a0._8_8_ = local_1e80._40_8_;
    auStack_51a0._0_8_ = local_1e80._32_8_;
    local_51c0._8_8_ = local_1e80._8_8_;
    local_51c0._0_8_ = local_1e80._0_8_;
    sStack_51b0.m_other = (double)local_1e80._16_8_;
    vStack_51a8.m_value = local_1e80._24_8_;
    sStack_5188.m_other = auVar17._24_8_;
    peStack_5190 = (element_type *)(local_a80 + 0x700);
    Eigen::PlainObjectBase<Eigen::Matrix<double,96,6,0,96,6>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,16,96,false>>,Eigen::Matrix<double,16,6,1,16,6>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,96,6,0,96,6>> *)local_1580,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>,_Eigen::Matrix<double,_16,_6,_1,_16,_6>,_0>_>
                *)local_51c0);
    local_6400.m_storage.m_cols = 0;
    local_6400.m_storage.m_data = (double *)0x0;
    local_6400.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_6400,0x30,0xc0)
    ;
    lVar22 = 0;
    local_6470 = 0;
    lVar18 = lVar21 * 0x6000000000 + 0x2000000000 >> 0x20;
    lVar20 = lVar21 * 0x6000000000 + 0x4000000000 >> 0x20;
    local_5f98 = lVar21;
    while( true ) {
      pdVar5 = local_63e8;
      if (lVar22 == 0x10) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,startCol);
      auVar17 = _auStack_51a0;
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      sStack_5188.m_other = auVar17._24_8_;
      peStack_5190 = (element_type *)local_1580;
      vStack_5178.m_value = 0;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0x60;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,local_6470,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,lVar18);
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_6408;
      vStack_5178.m_value = 0x20;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0x60;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,local_6470,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,lVar20);
      pMVar4 = local_63e0;
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_63e0;
      vStack_5178.m_value = 0x40;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0x60;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,local_6470,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar20);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,lVar18);
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      sStack_5188.m_other = (double)local_6408;
      vStack_5170.m_value = 0x20;
      local_5168.m_value = 0;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)pMVar4;
      local_5108.m_value = 0x40;
      local_5100.m_other = 0.0;
      local_50f8 = (RhsNested)0x60;
      vStack_5178.m_value = (long)local_1580;
      local_5110.m_value = (long)local_1580;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,local_6470,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar20);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,startCol);
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)pMVar4;
      local_5108.m_value = 0x40;
      local_5100.m_other = 0.0;
      local_50f8 = (RhsNested)0x60;
      vStack_5178.m_value = (long)local_1580;
      local_5110.m_value = (long)local_1580;
      sStack_5188.m_other = (double)local_1580;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,local_6470,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar18);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,startCol);
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6408;
      local_5108.m_value = 0x20;
      local_5100.m_other = 0.0;
      local_50f8 = (RhsNested)0x60;
      vStack_5178.m_value = (long)local_1580;
      local_5110.m_value = (long)local_1580;
      sStack_5188.m_other = (double)local_1580;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,local_6470,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,startCol);
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_63c8;
      vStack_5178.m_value = 0;
      vStack_5170.m_value = 1;
      local_5168.m_value = 0x60;
      lVar21 = local_6470 + 1;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,lVar18);
      pMVar6 = local_63d0;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_63d0;
      vStack_5178.m_value = 0x20;
      vStack_5170.m_value = 1;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,lVar20);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_63d8;
      vStack_5178.m_value = 0x40;
      vStack_5170.m_value = 1;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar20);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,lVar18);
      pMVar3 = local_63d8;
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5178.m_value = (long)local_1580;
      sStack_5188.m_other = (double)pMVar6;
      vStack_5170.m_value = 0x20;
      local_5168.m_value = 1;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_63d8;
      local_5108.m_value = 0x40;
      local_5100.m_other = 4.94065645841247e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar20);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,startCol);
      p_Var7 = local_63c8;
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5178.m_value = (long)local_1580;
      sStack_5188.m_other = (double)local_63c8;
      vStack_5170.m_value = 0;
      local_5168.m_value = 1;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)pMVar3;
      local_5108.m_value = 0x40;
      local_5100.m_other = 4.94065645841247e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar18);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,startCol);
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5178.m_value = (long)local_1580;
      sStack_5188.m_other = (double)p_Var7;
      vStack_5170.m_value = 0;
      local_5168.m_value = 1;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_63d0;
      local_5108.m_value = 0x20;
      local_5100.m_other = 4.94065645841247e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,startCol);
      ppCVar8 = local_63c0;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_63c0;
      vStack_5178.m_value = 0;
      vStack_5170.m_value = 2;
      local_5168.m_value = 0x60;
      lVar21 = local_6470 + 2;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,lVar18);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_6418;
      vStack_5178.m_value = 0x20;
      vStack_5170.m_value = 2;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1e80,xpr,
                 lVar22,lVar20);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1580;
      auStack_51a0._8_8_ = local_1e80._40_8_;
      auStack_51a0._0_8_ = local_1e80._32_8_;
      local_51c0._8_8_ = local_1e80._8_8_;
      local_51c0._0_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._16_8_;
      vStack_51a8.m_value = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_6410;
      vStack_5178.m_value = 0x40;
      vStack_5170.m_value = 2;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar20);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,lVar18);
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5178.m_value = (long)local_1580;
      sStack_5188.m_other = (double)local_6418;
      vStack_5170.m_value = 0x20;
      local_5168.m_value = 2;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6410;
      local_5108.m_value = 0x40;
      local_5100.m_other = 9.88131291682493e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar20);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,startCol);
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5178.m_value = (long)local_1580;
      sStack_5188.m_other = (double)ppCVar8;
      vStack_5170.m_value = 0;
      local_5168.m_value = 2;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6410;
      local_5108.m_value = 0x40;
      local_5100.m_other = 9.88131291682493e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar22,lVar18);
      local_1e80._32_8_ = vStack_61e0.m_value;
      local_1e80._40_8_ = peStack_61d8;
      local_1e80._0_8_ = local_6200._0_8_;
      local_1e80._8_8_ = local_6200._8_8_;
      local_1e80._16_8_ = LStack_61f0.m_matrix;
      local_1e80._24_8_ = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar22,startCol);
      sStack_5130.m_other = (double)vStack_5f60.m_value;
      peStack_5128 = (element_type *)sStack_5f58.m_other;
      local_5150 = (element_type *)local_5f80._0_8_;
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f80._8_8_;
      local_5140 = (element_type *)sStack_5f70.m_other;
      sStack_5138.m_other = (double)vStack_5f68.m_value;
      auStack_51a0._8_8_ = local_1e80._32_8_;
      auStack_51a0._0_8_ = local_1e80._24_8_;
      peStack_5190 = (element_type *)local_1e80._40_8_;
      local_51c0._8_8_ = local_1e80._0_8_;
      sStack_51b0.m_other = (double)local_1e80._8_8_;
      vStack_51a8.m_value = local_1e80._16_8_;
      vStack_5178.m_value = (long)local_1580;
      sStack_5188.m_other = (double)ppCVar8;
      vStack_5170.m_value = 0;
      local_5168.m_value = 2;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6418;
      local_5108.m_value = 0x20;
      local_5100.m_other = 9.88131291682493e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6400,lVar21,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      local_6470 = local_6470 + 3;
      lVar22 = lVar22 + 1;
      peVar23 = local_63b8;
    }
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_5df8;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *local_63e8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_6328;
    auVar1 = vfmadd213sd_fma(auVar25,auVar26,auVar1);
    local_5a00._0_8_ = auVar1._0_8_;
    local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [3] = 0.0;
    local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [4] = 0.0;
    local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [5] = 4.74303020007597e-322;
    local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1580;
    local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [2] = (double)local_1580;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_96,_3,_false>_>
                      *)local_6200,(double *)local_5a00,(StorageBaseType *)&local_6320);
    local_5c40._0_8_ = local_c80;
    local_5b00._0_8_ = *pdVar5 * local_6328;
    local_5c28.m_value = 0;
    local_5c20.m_value = 3;
    local_5c18 = (PointerType)0x60;
    local_5c40._16_8_ = (element_type *)local_1580;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_96,_3,_false>_>
                      *)local_5f80,(double *)local_5b00,(StorageBaseType *)local_5c40);
    auStack_51a0._8_8_ = vStack_61e0.m_value;
    auStack_51a0._0_8_ = vStack_61e8.m_value;
    peStack_5190 = peStack_61d8;
    sStack_5188.m_other = sStack_61d0.m_other;
    vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)vStack_61c8.m_value;
    vStack_5178.m_value = (long)peStack_61c0;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)sStack_5f70.m_other;
    sStack_5130.m_other = (double)vStack_5f48.m_value;
    peStack_5128 = peStack_5f40;
    local_5150 = (element_type *)vStack_5f68.m_value;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vStack_5f60.m_value;
    local_5140 = (element_type *)sStack_5f58.m_other;
    sStack_5138.m_other = (double)vStack_5f50.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,96,3,0,96,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,3,0,96,3>const>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,96,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,3,0,96,3>const>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,96,3,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,96,3,0,96,3>> *)local_1e80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_96,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_96,_3,_false>_>_>_>
                *)local_51c0);
    lVar21 = 0;
    local_6428 = local_5f98 << 5;
    while( true ) {
      if (lVar21 == 3) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
                 local_6420,local_6428,0);
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)&local_6320,
                 (Matrix<double,_96,_3,_0,_96,_3> *)local_1e80,0,lVar21);
      vStack_5f60.m_value =
           (long)local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_5f58.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_5f80._0_8_ =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_5f80._8_8_ =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      sStack_5f70.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[2];
      vStack_5f68.m_value =
           (long)local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>
                  *)local_5f80,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
                 local_6420,local_6428,0);
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)&local_6320,
                 (Matrix<double,_96,_3,_0,_96,_3> *)local_1e80,0x20,lVar21);
      vStack_5f60.m_value =
           (long)local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_5f58.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_5f80._0_8_ =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_5f80._8_8_ =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      sStack_5f70.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[2];
      vStack_5f68.m_value =
           (long)local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>
                  *)local_5f80,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
                 local_6420,local_6428,0);
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._8_8_ = local_6200._8_8_;
      local_51c0._0_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)&local_6320,
                 (Matrix<double,_96,_3,_0,_96,_3> *)local_1e80,0x40,lVar21);
      vStack_5f60.m_value =
           (long)local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_5f58.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_5f80._0_8_ =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_5f80._8_8_ =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      sStack_5f70.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[2];
      vStack_5f68.m_value =
           (long)local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>
                  *)local_5f80,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                  *)local_51c0);
      lVar21 = lVar21 + 1;
    }
    local_6450.m_storage.m_cols = 0;
    local_6450.m_storage.m_data = (double *)0x0;
    local_6450.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_6450,0x30,0xc0)
    ;
    lVar21 = 0;
    local_6470 = 0;
    while( true ) {
      pCVar9 = local_5fa0;
      IVar2 = local_6428;
      if (lVar21 == 0x10) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,startCol);
      auVar17 = _auStack_51a0;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      sStack_5188.m_other = auVar17._24_8_;
      peStack_5190 = (element_type *)pDStack_5180;
      vStack_5178.m_value = 0;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,local_6470,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,lVar18);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_6330;
      vStack_5178.m_value = 0x20;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,local_6470,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,lVar20);
      pMVar3 = local_5df0;
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._8_8_ = local_6200._8_8_;
      local_51c0._0_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_5df0;
      vStack_5178.m_value = 0x40;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,local_6470,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar20);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,lVar18);
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      sStack_5188.m_other = (double)local_6330;
      vStack_5178.m_value = (long)local_1e80;
      vStack_5170.m_value = 0x20;
      local_5168.m_value = 0;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)pMVar3;
      local_5108.m_value = 0x40;
      local_5100.m_other = 0.0;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,local_6470,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar20);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,startCol);
      vStack_5178.m_value = (long)local_1e80;
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)pMVar3;
      local_5108.m_value = 0x40;
      local_5100.m_other = 0.0;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      sStack_5188.m_other = (double)vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,local_6470,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar18);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,startCol);
      vStack_5178.m_value = (long)local_1e80;
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      vStack_5170.m_value = 0;
      local_5168.m_value = 0;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6330;
      local_5108.m_value = 0x20;
      local_5100.m_other = 0.0;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      sStack_5188.m_other = (double)vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,local_6470,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,startCol);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_6348;
      vStack_5178.m_value = 0;
      vStack_5170.m_value = 1;
      local_5168.m_value = 0x60;
      lVar22 = local_6470 + 1;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,lVar18);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_6340;
      vStack_5178.m_value = 0x20;
      vStack_5170.m_value = 1;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,lVar20);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._8_8_ = local_6200._8_8_;
      local_51c0._0_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_6338;
      vStack_5178.m_value = 0x40;
      vStack_5170.m_value = 1;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar20);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,lVar18);
      vStack_5178.m_value = (long)local_1e80;
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      sStack_5188.m_other = (double)local_6340;
      vStack_5170.m_value = 0x20;
      local_5168.m_value = 1;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6338;
      local_5108.m_value = 0x40;
      local_5100.m_other = 4.94065645841247e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar20);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,startCol);
      vStack_5178.m_value = (long)local_1e80;
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      sStack_5188.m_other = (double)local_6348;
      vStack_5170.m_value = 0;
      local_5168.m_value = 1;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6338;
      local_5108.m_value = 0x40;
      local_5100.m_other = 4.94065645841247e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar18);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,startCol);
      vStack_5178.m_value = (long)local_1e80;
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      sStack_5188.m_other = (double)local_6348;
      vStack_5170.m_value = 0;
      local_5168.m_value = 1;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6340;
      local_5108.m_value = 0x20;
      local_5100.m_other = 4.94065645841247e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,startCol);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_6360;
      vStack_5178.m_value = 0;
      vStack_5170.m_value = 2;
      local_5168.m_value = 0x60;
      lVar22 = local_6470 + 2;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,lVar18);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._0_8_ = local_6200._0_8_;
      local_51c0._8_8_ = local_6200._8_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_6358;
      vStack_5178.m_value = 0x20;
      vStack_5170.m_value = 2;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6200,xpr,
                 lVar21,lVar20);
      pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_1e80;
      auStack_51a0._8_8_ = peStack_61d8;
      auStack_51a0._0_8_ = vStack_61e0.m_value;
      local_51c0._8_8_ = local_6200._8_8_;
      local_51c0._0_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
      vStack_51a8.m_value = vStack_61e8.m_value;
      peStack_5190 = (element_type *)local_6350;
      vStack_5178.m_value = 0x40;
      vStack_5170.m_value = 2;
      local_5168.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar20);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,lVar18);
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      vStack_5178.m_value = (long)local_1e80;
      sStack_5188.m_other = (double)local_6358;
      vStack_5170.m_value = 0x20;
      local_5168.m_value = 2;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6350;
      local_5108.m_value = 0x40;
      local_5100.m_other = 9.88131291682493e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar20);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,startCol);
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      vStack_5178.m_value = (long)local_1e80;
      sStack_5188.m_other = (double)local_6360;
      vStack_5170.m_value = 0;
      local_5168.m_value = 2;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6350;
      local_5108.m_value = 0x40;
      local_5100.m_other = 9.88131291682493e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5f80,xpr,
                 lVar21,lVar18);
      vStack_61e0.m_value = vStack_5f60.m_value;
      peStack_61d8 = (element_type *)sStack_5f58.m_other;
      local_6200._0_8_ = local_5f80._0_8_;
      local_6200._8_8_ = local_5f80._8_8_;
      LStack_61f0.m_matrix = (non_const_type)sStack_5f70.m_other;
      vStack_61e8.m_value = vStack_5f68.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_6320,xpr,
                 lVar21,startCol);
      sStack_5130.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_5128 = (element_type *)
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_5150 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_5140 = (element_type *)
                   local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_5138.m_other =
           local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_51a0._8_8_ = vStack_61e0.m_value;
      auStack_51a0._0_8_ = vStack_61e8.m_value;
      peStack_5190 = peStack_61d8;
      local_51c0._8_8_ = local_6200._0_8_;
      sStack_51b0.m_other = (double)local_6200._8_8_;
      vStack_51a8.m_value = (long)LStack_61f0.m_matrix;
      vStack_5178.m_value = (long)local_1e80;
      sStack_5188.m_other = (double)local_6360;
      vStack_5170.m_value = 0;
      local_5168.m_value = 2;
      sStack_5160.m_other = 4.74303020007597e-322;
      local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6358;
      local_5108.m_value = 0x20;
      local_5100.m_other = 9.88131291682493e-324;
      local_50f8 = (RhsNested)0x60;
      local_5110.m_value = vStack_5178.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,lVar22,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5c40,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_51c0);
      local_6470 = local_6470 + 3;
      lVar21 = lVar21 + 1;
      peVar23 = local_63b8;
    }
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               local_51c0,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((local_5fa0->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_material).
                       super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + local_6428));
    memcpy(&local_6320,(ChMatrixNM<double,_6,_6> *)(local_51c0._0_8_ + 0x20),0x120);
    this_00 = (ChElementShellANCF_3443 *)(local_51c0 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    RotateReorderStiffnessMatrix
              (this_00,&local_6320,
               *(double *)
                ((long)&((pCVar9->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_theta + IVar2));
    local_6380.m_storage.m_cols = 0;
    local_6380.m_storage.m_data = (double *)0x0;
    local_6380.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_6380,0x30,0xc0)
    ;
    puVar10 = local_5e00;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_21c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5a00,(double *)&local_6320,(StorageBaseType *)local_21c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_20c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5b00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)&local_20c0);
    uVar11 = local_5a00._16_8_;
    local_6430 = (double)local_5b00._16_8_;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_59e8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_59e0;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_59d8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_59d0.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_59c8.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = dStack_59c0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_5ae8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_5ae0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_5ad8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_5ad0.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_5ac8.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_5ac0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_55c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x40);
    Eigen::operator*(local_5800,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)&local_55c0);
    IVar2 = local_5800[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            m_outerStride;
    vVar16.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar15.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar14 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              m_xpr;
    uVar13 = local_5800[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             ._8_8_;
    pdVar12 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
              .m_data;
    local_5c20.m_value = uVar11;
    dStack_5bf8 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    dStack_5bf0 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[5];
    local_5c18 = (PointerType)
                 local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[0];
    dStack_5c10 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5c08 = (XprTypeNested)
                   local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5c00 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5bd0 = local_6430;
    dStack_5ba8 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5ba0 = (RhsNested)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pdStack_5bc8 = (PointerType)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5bc0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    local_5bb8 = (XprTypeNested)
                 local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5bb0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5b78 = local_5800[0].m_lhs.m_functor.m_other;
    puVar10[2] = local_5800[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_xpr;
    puVar10[3] = vVar15.m_value;
    puVar10[4] = vVar16.m_value;
    puVar10[5] = IVar2;
    *puVar10 = pdVar12;
    puVar10[1] = uVar13;
    puVar10[2] = pMVar14;
    puVar10[3] = vVar15.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5d20,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x60);
    Eigen::operator*(local_53c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)local_5d20);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5c40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_53c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5de8,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x80);
    Eigen::operator*(local_54c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)local_5de8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_54c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_6020,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_1fc0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)local_6020);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_1fc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6380,0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (CwiseBinaryOp<_149c88d9_> *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_21c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5a00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)local_21c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_20c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5b00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)&local_20c0);
    uVar11 = local_5a00._16_8_;
    local_6430 = (double)local_5b00._16_8_;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_59e8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_59e0;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_59d8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_59d0.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_59c8.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = dStack_59c0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_5ae8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_5ae0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_5ad8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_5ad0.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_5ac8.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_5ac0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_55c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x40);
    Eigen::operator*(local_5800,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)&local_55c0);
    IVar2 = local_5800[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            m_outerStride;
    vVar16.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar15.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar14 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              m_xpr;
    uVar13 = local_5800[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             ._8_8_;
    pdVar12 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
              .m_data;
    local_5c20.m_value = uVar11;
    dStack_5bf8 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    dStack_5bf0 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[5];
    local_5c18 = (PointerType)
                 local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[0];
    dStack_5c10 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5c08 = (XprTypeNested)
                   local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5c00 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5bd0 = local_6430;
    dStack_5ba8 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5ba0 = (RhsNested)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pdStack_5bc8 = (PointerType)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5bc0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    local_5bb8 = (XprTypeNested)
                 local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5bb0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5b78 = local_5800[0].m_lhs.m_functor.m_other;
    puVar10[2] = local_5800[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_xpr;
    puVar10[3] = vVar15.m_value;
    puVar10[4] = vVar16.m_value;
    puVar10[5] = IVar2;
    *puVar10 = pdVar12;
    puVar10[1] = uVar13;
    puVar10[2] = pMVar14;
    puVar10[3] = vVar15.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5d20,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x60);
    Eigen::operator*(local_53c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)local_5d20);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5c40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_53c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5de8,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x80);
    Eigen::operator*(local_54c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)local_5de8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_54c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_6020,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_1fc0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)local_6020);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_1fc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6380,0,0x20);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (CwiseBinaryOp<_149c88d9_> *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_21c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5a00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)local_21c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_20c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5b00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)&local_20c0);
    uVar11 = local_5a00._16_8_;
    local_6430 = (double)local_5b00._16_8_;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_59e8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_59e0;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_59d8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_59d0.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_59c8.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = dStack_59c0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_5ae8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_5ae0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_5ad8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_5ad0.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_5ac8.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_5ac0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_55c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x40);
    Eigen::operator*(local_5800,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)&local_55c0);
    IVar2 = local_5800[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            m_outerStride;
    vVar16.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar15.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar14 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              m_xpr;
    uVar13 = local_5800[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             ._8_8_;
    pdVar12 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
              .m_data;
    local_5c20.m_value = uVar11;
    dStack_5bf8 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    dStack_5bf0 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[5];
    local_5c18 = (PointerType)
                 local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[0];
    dStack_5c10 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5c08 = (XprTypeNested)
                   local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5c00 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5bd0 = local_6430;
    dStack_5ba8 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5ba0 = (RhsNested)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pdStack_5bc8 = (PointerType)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5bc0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    local_5bb8 = (XprTypeNested)
                 local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5bb0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5b78 = local_5800[0].m_lhs.m_functor.m_other;
    puVar10[2] = local_5800[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_xpr;
    puVar10[3] = vVar15.m_value;
    puVar10[4] = vVar16.m_value;
    puVar10[5] = IVar2;
    *puVar10 = pdVar12;
    puVar10[1] = uVar13;
    puVar10[2] = pMVar14;
    puVar10[3] = vVar15.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5d20,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x60);
    Eigen::operator*(local_53c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)local_5d20);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5c40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_53c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5de8,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x80);
    Eigen::operator*(local_54c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)local_5de8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_54c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_6020,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_1fc0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)local_6020);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_1fc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6380,0,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (CwiseBinaryOp<_149c88d9_> *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_21c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5a00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x12,(StorageBaseType *)local_21c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_20c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5b00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)&local_20c0);
    uVar11 = local_5a00._16_8_;
    local_6430 = (double)local_5b00._16_8_;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_59e8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_59e0;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_59d8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_59d0.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_59c8.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = dStack_59c0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_5ae8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_5ae0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_5ad8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_5ad0.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_5ac8.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_5ac0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_55c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x40);
    Eigen::operator*(local_5800,local_5fa8,(StorageBaseType *)&local_55c0);
    IVar2 = local_5800[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            m_outerStride;
    vVar16.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar15.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar14 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              m_xpr;
    uVar13 = local_5800[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             ._8_8_;
    pdVar12 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
              .m_data;
    local_5c20.m_value = uVar11;
    dStack_5bf8 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    dStack_5bf0 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[5];
    local_5c18 = (PointerType)
                 local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[0];
    dStack_5c10 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5c08 = (XprTypeNested)
                   local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5c00 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5bd0 = local_6430;
    dStack_5ba8 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5ba0 = (RhsNested)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pdStack_5bc8 = (PointerType)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5bc0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    local_5bb8 = (XprTypeNested)
                 local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5bb0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5b78 = local_5800[0].m_lhs.m_functor.m_other;
    puVar10[2] = local_5800[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_xpr;
    puVar10[3] = vVar15.m_value;
    puVar10[4] = vVar16.m_value;
    puVar10[5] = IVar2;
    *puVar10 = pdVar12;
    puVar10[1] = uVar13;
    puVar10[2] = pMVar14;
    puVar10[3] = vVar15.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5d20,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x60);
    Eigen::operator*(local_53c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)local_5d20);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5c40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_53c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5de8,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x80);
    Eigen::operator*(local_54c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)local_5de8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_54c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_6020,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_1fc0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)local_6020);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_1fc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6380,0,0x60);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (CwiseBinaryOp<_149c88d9_> *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_21c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5a00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)local_21c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_20c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5b00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)&local_20c0);
    uVar11 = local_5a00._16_8_;
    local_6430 = (double)local_5b00._16_8_;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_59e8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_59e0;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_59d8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_59d0.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_59c8.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = dStack_59c0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_5ae8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_5ae0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_5ad8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_5ad0.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_5ac8.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_5ac0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_55c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x40);
    Eigen::operator*(local_5800,local_5fb0,(StorageBaseType *)&local_55c0);
    IVar2 = local_5800[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            m_outerStride;
    vVar16.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar15.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar14 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              m_xpr;
    uVar13 = local_5800[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             ._8_8_;
    pdVar12 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
              .m_data;
    local_5c20.m_value = uVar11;
    dStack_5bf8 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    dStack_5bf0 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[5];
    local_5c18 = (PointerType)
                 local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[0];
    dStack_5c10 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5c08 = (XprTypeNested)
                   local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5c00 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5bd0 = local_6430;
    dStack_5ba8 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5ba0 = (RhsNested)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pdStack_5bc8 = (PointerType)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5bc0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    local_5bb8 = (XprTypeNested)
                 local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5bb0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5b78 = local_5800[0].m_lhs.m_functor.m_other;
    puVar10[2] = local_5800[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_xpr;
    puVar10[3] = vVar15.m_value;
    puVar10[4] = vVar16.m_value;
    puVar10[5] = IVar2;
    *puVar10 = pdVar12;
    puVar10[1] = uVar13;
    puVar10[2] = pMVar14;
    puVar10[3] = vVar15.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5d20,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x60);
    Eigen::operator*(local_53c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)local_5d20);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5c40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_53c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5de8,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x80);
    Eigen::operator*(local_54c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)local_5de8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_54c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_6020,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_1fc0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)local_6020);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_1fc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6380,0,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (CwiseBinaryOp<_149c88d9_> *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_21c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5a00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)local_21c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_20c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_5b00,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)&local_20c0);
    uVar11 = local_5a00._16_8_;
    local_6430 = (double)local_5b00._16_8_;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_59e8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_59e0;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_59d8;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_59d0.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_59c8.m_value;
    local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = dStack_59c0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_5ae8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = dStack_5ae0;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_5ad8;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_5ad0.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_5ac8.m_value;
    local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_5ac0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_55c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x40);
    Eigen::operator*(local_5800,local_5fc0,(StorageBaseType *)&local_55c0);
    IVar2 = local_5800[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            m_outerStride;
    vVar16.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar15.m_value =
         local_5800[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar14 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              m_xpr;
    uVar13 = local_5800[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             ._8_8_;
    pdVar12 = local_5800[0].m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
              .m_data;
    local_5c20.m_value = uVar11;
    dStack_5bf8 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    dStack_5bf0 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[5];
    local_5c18 = (PointerType)
                 local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[0];
    dStack_5c10 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5c08 = (XprTypeNested)
                   local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5c00 = local_5700.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5bd0 = local_6430;
    dStack_5ba8 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5ba0 = (RhsNested)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pdStack_5bc8 = (PointerType)
                   local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5bc0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    local_5bb8 = (XprTypeNested)
                 local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5bb0 = local_5900.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5b78 = local_5800[0].m_lhs.m_functor.m_other;
    puVar10[2] = local_5800[0].m_rhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_xpr;
    puVar10[3] = vVar15.m_value;
    puVar10[4] = vVar16.m_value;
    puVar10[5] = IVar2;
    *puVar10 = pdVar12;
    puVar10[1] = uVar13;
    puVar10[2] = pMVar14;
    puVar10[3] = vVar15.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5d20,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x60);
    Eigen::operator*(local_53c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)local_5d20);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5c40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_53c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5de8,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0x80);
    Eigen::operator*(local_54c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)local_5de8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5f80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_54c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_6020,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6450,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_1fc0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)local_6020);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_1fc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_6380,0,0xa0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_63b0,
               (CwiseBinaryOp<_149c88d9_> *)local_51c0);
    local_6200._0_8_ = &local_6380;
    local_51c0 = (undefined1  [16])
                 Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_6400,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                             *)local_6200);
    local_5f80._0_8_ = peVar23;
    Eigen::
    NoAlias<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::MatrixBase>
    ::operator+=((NoAlias<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::MatrixBase>
                  *)local_5f80,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>_>
                  *)local_51c0);
    ppCVar8 = local_63c0;
    p_Var7 = local_63c8;
    _auStack_51a0 = ZEXT824((XprTypeNested)local_1580);
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_c80;
    sStack_5188.m_other = 4.74303020007597e-322;
    local_50a8 = (Matrix<double,__1,__1,_1,__1,__1> *)(local_a80 + 0x400);
    local_5118.m_value = (long)(local_a80 + 0x100);
    local_5168.m_value = 0;
    sStack_5160.m_other = 1.48219693752374e-323;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = local_63c8;
    sStack_5130.m_other = 0.0;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5100.m_other = 0.0;
    local_50f8 = (RhsNested)0x4;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = (Matrix<double,__1,__1,_1,__1,__1> *)local_63c0;
    local_50c0.m_value = 0;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5090 = (undefined1 *)0x0;
    local_5088.m_other = 2.47032822920623e-323;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    sStack_51b0.m_other = (double)local_1580;
    vStack_5170.m_value = (long)local_1580;
    sStack_5138.m_other = (double)local_1580;
    local_5108.m_value = (long)local_1580;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5f80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    _auStack_51a0 = ZEXT824((XprTypeNested)local_1580);
    sStack_5188.m_other = 4.74303020007597e-322;
    local_5168.m_value = 0;
    sStack_5160.m_other = 0.0;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = p_Var7;
    sStack_5130.m_other = 0.0;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5118.m_value = (long)p_Var7;
    local_5100.m_other = 0.0;
    local_50f8 = (RhsNested)0x1;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = (Matrix<double,__1,__1,_1,__1,__1> *)ppCVar8;
    local_50c0.m_value = 0;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50a8 = (Matrix<double,__1,__1,_1,__1,__1> *)ppCVar8;
    local_5090 = (undefined1 *)0x0;
    local_5088.m_other = 9.88131291682493e-324;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    sStack_51b0.m_other = (double)local_1580;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_1580;
    vStack_5170.m_value = (long)local_1580;
    sStack_5138.m_other = (double)local_1580;
    local_5108.m_value = (long)local_1580;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5c40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    local_51c0._0_8_ = &DAT_3ff0000000000000;
    local_6200._0_8_ = (element_type *)local_5c40;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               local_6200,(Scalar *)local_51c0);
    local_51c0._0_8_ = (element_type *)0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_> *)local_5c40,(Scalar *)local_51c0
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_51c0,local_63e8,(StorageBaseType *)local_5f80);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5c40,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
               local_6420,local_6428,0);
    local_5a00._0_8_ = local_5c40;
    auStack_51a0._8_8_ = peStack_61d8;
    auStack_51a0._0_8_ = vStack_61e0.m_value;
    local_51c0._0_8_ = local_6200._0_8_;
    local_51c0._8_8_ = local_6200._8_8_;
    sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
    vStack_51a8.m_value = vStack_61e8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_5a00,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_51c0);
    pMVar3 = local_63d0;
    pMVar4 = local_6408;
    sStack_51b0.m_other = (double)local_6408;
    auStack_51a0._8_8_ = 0x20;
    auStack_51a0._0_8_ = (RhsNested)local_1580;
    peStack_5190 = (element_type *)0x0;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)(local_c80 + 0x100);
    sStack_5188.m_other = 4.74303020007597e-322;
    local_50a8 = (Matrix<double,__1,__1,_1,__1,__1> *)(local_a80 + 0x500);
    local_5118.m_value = (long)(local_a80 + 0x200);
    local_5168.m_value = 0x20;
    sStack_5160.m_other = 1.48219693752374e-323;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_63d0;
    sStack_5130.m_other = 1.58101006669199e-322;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5100.m_other = 1.58101006669199e-322;
    local_50f8 = (RhsNested)0x4;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = local_6418;
    local_50c0.m_value = 0x20;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_6200._0_8_ = local_5f80;
    local_5090 = (undefined1 *)0x20;
    local_5088.m_other = 2.47032822920623e-323;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    vStack_5170.m_value = (long)local_1580;
    sStack_5138.m_other = (double)local_1580;
    local_5108.m_value = (long)local_1580;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)local_6200,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    vStack_5170.m_value = (long)local_1580;
    sStack_51b0.m_other = (double)pMVar4;
    auStack_51a0._8_8_ = 0x20;
    auStack_51a0._0_8_ = vStack_5170.m_value;
    peStack_5190 = (element_type *)0x0;
    sStack_5188.m_other = 4.74303020007597e-322;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)pMVar4;
    local_5168.m_value = 0x20;
    sStack_5160.m_other = 0.0;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar3;
    sStack_5130.m_other = 1.58101006669199e-322;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5118.m_value = (long)pMVar3;
    local_5100.m_other = 1.58101006669199e-322;
    local_50f8 = (RhsNested)0x1;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = local_6418;
    local_50c0.m_value = 0x20;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50a8 = local_6418;
    local_5090 = (undefined1 *)0x20;
    local_5088.m_other = 9.88131291682493e-324;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    sStack_5138.m_other = (double)vStack_5170.m_value;
    local_5108.m_value = vStack_5170.m_value;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)vStack_5170.m_value;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)vStack_5170.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5a00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    local_51c0._0_8_ = &DAT_3ff0000000000000;
    local_6200._0_8_ = (element_type *)local_5a00;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               local_6200,(Scalar *)local_51c0);
    local_51c0._0_8_ = (element_type *)0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_> *)local_5a00,(Scalar *)local_51c0
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_51c0,local_63e8,(StorageBaseType *)local_5f80);
    pMVar4 = local_63e0;
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5a00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
               local_6420,local_6428,0);
    local_5b00._0_8_ = local_5a00;
    auStack_51a0._8_8_ = peStack_61d8;
    auStack_51a0._0_8_ = vStack_61e0.m_value;
    local_51c0._0_8_ = local_6200._0_8_;
    local_51c0._8_8_ = local_6200._8_8_;
    sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
    vStack_51a8.m_value = vStack_61e8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_5b00,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_51c0);
    pMVar6 = local_63d8;
    pMVar3 = local_6410;
    sStack_51b0.m_other = (double)pMVar4;
    auStack_51a0._8_8_ = 0x40;
    auStack_51a0._0_8_ = (RhsNested)local_1580;
    peStack_5190 = (element_type *)0x0;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_a80;
    sStack_5188.m_other = 4.74303020007597e-322;
    local_5118.m_value = (long)(local_a80 + 0x300);
    local_5168.m_value = 0x40;
    sStack_5160.m_other = 1.48219693752374e-323;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_63d8;
    sStack_5130.m_other = 3.16202013338398e-322;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50a8 = (Matrix<double,__1,__1,_1,__1,__1> *)(local_a80 + 0x600);
    local_5100.m_other = 3.16202013338398e-322;
    local_50f8 = (RhsNested)0x4;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = local_6410;
    local_50c0.m_value = 0x40;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_6200._0_8_ = local_5f80;
    local_5090 = (undefined1 *)0x40;
    local_5088.m_other = 2.47032822920623e-323;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    vStack_5170.m_value = (long)local_1580;
    sStack_5138.m_other = (double)local_1580;
    local_5108.m_value = (long)local_1580;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)local_6200,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    vStack_5170.m_value = (long)local_1580;
    sStack_51b0.m_other = (double)local_63e0;
    auStack_51a0._8_8_ = 0x40;
    auStack_51a0._0_8_ = vStack_5170.m_value;
    peStack_5190 = (element_type *)0x0;
    sStack_5188.m_other = 4.74303020007597e-322;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_63e0;
    local_5168.m_value = 0x40;
    sStack_5160.m_other = 0.0;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar6;
    sStack_5130.m_other = 3.16202013338398e-322;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5118.m_value = (long)pMVar6;
    local_5100.m_other = 3.16202013338398e-322;
    local_50f8 = (RhsNested)0x1;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = pMVar3;
    local_50c0.m_value = 0x40;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50a8 = pMVar3;
    local_5090 = (undefined1 *)0x40;
    local_5088.m_other = 9.88131291682493e-324;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    sStack_5138.m_other = (double)vStack_5170.m_value;
    local_5108.m_value = vStack_5170.m_value;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)vStack_5170.m_value;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)vStack_5170.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5b00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    local_51c0._0_8_ = &DAT_3ff0000000000000;
    local_6200._0_8_ = (element_type *)local_5b00;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               local_6200,(Scalar *)local_51c0);
    pdVar5 = local_63e8;
    local_51c0._0_8_ = (element_type *)0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_> *)local_5b00,(Scalar *)local_51c0
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_51c0,pdVar5,(StorageBaseType *)local_5f80);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5b00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
               local_6420,local_6428,0);
    local_5800[0]._0_8_ = local_5b00;
    auStack_51a0._8_8_ = peStack_61d8;
    auStack_51a0._0_8_ = vStack_61e0.m_value;
    local_51c0._0_8_ = local_6200._0_8_;
    local_51c0._8_8_ = local_6200._8_8_;
    sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
    vStack_51a8.m_value = vStack_61e8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_5800,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_51c0);
    pMVar3 = local_63d0;
    auStack_51a0._8_8_ = local_63e0;
    sStack_5188.m_other = (double)local_1580;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)0x40;
    vStack_5178.m_value = 0;
    local_5168.m_value = (long)(local_c80 + 0x100);
    vStack_5170.m_value = 0x60;
    local_5150 = (element_type *)0x20;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
    local_5140 = (element_type *)0x60;
    sStack_5130.m_other = (double)local_63d8;
    local_5118.m_value = 0x40;
    local_5100.m_other = (double)(local_a80 + 0x200);
    local_5110.m_value = 1;
    local_5108.m_value = 0x60;
    local_50e8 = 1.58101006669199e-322;
    local_50e0.m_other = 1.97626258336499e-323;
    local_50d8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x60;
    local_50c0.m_value = (long)local_6410;
    local_50a8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x40;
    local_5090 = local_a80 + 0x500;
    local_50a0.m_other = 9.88131291682493e-324;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5078 = 1.58101006669199e-322;
    local_5020 = local_a80;
    local_5070 = (XprTypeNested)0x5;
    local_5068.m_value = 0x60;
    local_5050 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_6408;
    local_5038 = 1.58101006669199e-322;
    sStack_5030.m_other = 0.0;
    local_5028 = (PointerType)0x60;
    local_5008.m_value = 0x40;
    local_5000 = 1.48219693752374e-323;
    local_4fb0.m_value = (long)(local_a80 + 0x300);
    local_4ff8 = 4.74303020007597e-322;
    local_4fe0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_63d0;
    local_4fc8 = 1.58101006669199e-322;
    local_4fc0 = (XprTypeNested)0x1;
    local_4fb8.m_value = 0x60;
    local_4f98 = 3.16202013338398e-322;
    local_4f90 = 1.97626258336499e-323;
    local_4f40 = local_a80 + 0x600;
    local_4f88 = 4.74303020007597e-322;
    local_4f70 = local_6418;
    local_4f58 = 1.58101006669199e-322;
    local_4f50 = 9.88131291682493e-324;
    local_4f48 = 4.74303020007597e-322;
    local_6200._0_8_ = local_5f80;
    local_4f28 = 3.16202013338398e-322;
    local_4f20 = 2.47032822920623e-323;
    local_4f18 = 4.74303020007597e-322;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5040 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5010.m_value = (long)local_1580;
    local_4fd0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4fa0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4f60 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4f30 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)local_6200,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    sStack_51b0.m_other = (double)local_6408;
    auStack_51a0._8_8_ = 0x20;
    auStack_51a0._0_8_ =
         (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          *)local_1580;
    peStack_5190 = (element_type *)0x0;
    sStack_5188.m_other = 4.74303020007597e-322;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_63e0;
    local_5168.m_value = 0x40;
    sStack_5160.m_other = 0.0;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar3;
    sStack_5130.m_other = 1.58101006669199e-322;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5118.m_value = (long)local_63d8;
    local_5100.m_other = 3.16202013338398e-322;
    local_50f8 = (RhsNested)0x1;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = local_6418;
    local_50c0.m_value = 0x20;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50a8 = local_6410;
    local_5090 = (undefined1 *)0x40;
    local_5088.m_other = 9.88131291682493e-324;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    vStack_5170.m_value = (long)local_1580;
    sStack_5138.m_other = (double)local_1580;
    local_5108.m_value = (long)local_1580;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5800,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_51c0,local_63e8,(StorageBaseType *)local_5f80);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5800,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
               local_6420,local_6428,0);
    pMVar4 = local_63e0;
    local_53c0[0]._0_8_ = local_5800;
    auStack_51a0._8_8_ = peStack_61d8;
    auStack_51a0._0_8_ = vStack_61e0.m_value;
    local_51c0._0_8_ = local_6200._0_8_;
    local_51c0._8_8_ = local_6200._8_8_;
    sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
    vStack_51a8.m_value = vStack_61e8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_53c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_51c0);
    p_Var7 = local_63c8;
    auStack_51a0._8_8_ = pMVar4;
    sStack_5188.m_other = (double)local_1580;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)0x40;
    vStack_5178.m_value = 0;
    local_5168.m_value = (long)local_c80;
    vStack_5170.m_value = 0x60;
    local_5150 = (element_type *)0x0;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
    local_5140 = (element_type *)0x60;
    sStack_5130.m_other = (double)local_63d8;
    local_5118.m_value = 0x40;
    local_5100.m_other = (double)(local_a80 + 0x100);
    local_5110.m_value = 1;
    local_5108.m_value = 0x60;
    local_50e8 = 0.0;
    local_50e0.m_other = 1.97626258336499e-323;
    local_50d8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x60;
    local_50c0.m_value = (long)local_6410;
    local_50a8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x40;
    local_5090 = local_a80 + 0x400;
    local_50a0.m_other = 9.88131291682493e-324;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5078 = 0.0;
    local_5070 = (XprTypeNested)0x5;
    local_5068.m_value = 0x60;
    *local_5fb8 = 0.0;
    local_5fb8[1] = 0.0;
    local_5028 = (PointerType)0x60;
    local_5008.m_value = 0x40;
    local_5000 = 1.48219693752374e-323;
    local_4ff8 = 4.74303020007597e-322;
    local_4fe0 = local_63c8;
    local_4fc8 = 0.0;
    local_4fc0 = (XprTypeNested)0x1;
    local_4fb8.m_value = 0x60;
    local_4f98 = 3.16202013338398e-322;
    local_4f90 = 1.97626258336499e-323;
    local_4f88 = 4.74303020007597e-322;
    local_4f40 = local_a80 + 0x600;
    local_4f70 = (Matrix<double,__1,__1,_1,__1,__1> *)local_63c0;
    local_4f58 = 0.0;
    local_4f50 = 9.88131291682493e-324;
    local_4f48 = 4.74303020007597e-322;
    local_6200._0_8_ = local_5f80;
    local_4f28 = 3.16202013338398e-322;
    local_4f20 = 2.47032822920623e-323;
    local_4f18 = 4.74303020007597e-322;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5050 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5040 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5020 = local_a80;
    local_5010.m_value = (long)local_1580;
    local_4fd0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4fb0.m_value = (long)(local_a80 + 0x300);
    local_4fa0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4f60 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4f30 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)local_6200,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    _auStack_51a0 =
         ZEXT824((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580);
    sStack_5188.m_other = 4.74303020007597e-322;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_63e0;
    local_5168.m_value = 0x40;
    sStack_5160.m_other = 0.0;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = p_Var7;
    sStack_5130.m_other = 0.0;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5118.m_value = (long)local_63d8;
    local_5100.m_other = 3.16202013338398e-322;
    local_50f8 = (RhsNested)0x1;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = (Matrix<double,__1,__1,_1,__1,__1> *)local_63c0;
    local_50c0.m_value = 0;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50a8 = local_6410;
    local_5090 = (undefined1 *)0x40;
    local_5088.m_other = 9.88131291682493e-324;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    sStack_51b0.m_other = (double)local_1580;
    vStack_5170.m_value = (long)local_1580;
    sStack_5138.m_other = (double)local_1580;
    local_5108.m_value = (long)local_1580;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_53c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_51c0,local_63e8,(StorageBaseType *)local_5f80);
    pMVar3 = local_6418;
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_53c0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
               local_6420,local_6428,0);
    local_54c0[0]._0_8_ = local_53c0;
    auStack_51a0._8_8_ = peStack_61d8;
    auStack_51a0._0_8_ = vStack_61e0.m_value;
    local_51c0._0_8_ = local_6200._0_8_;
    local_51c0._8_8_ = local_6200._8_8_;
    sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
    vStack_51a8.m_value = vStack_61e8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_54c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_51c0);
    ppCVar8 = local_63c0;
    auStack_51a0._8_8_ = local_6408;
    sStack_5188.m_other = (double)local_1580;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)0x20;
    vStack_5178.m_value = 0;
    local_5168.m_value = (long)local_c80;
    vStack_5170.m_value = 0x60;
    local_5150 = (element_type *)0x0;
    local_5148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
    local_5140 = (element_type *)0x60;
    sStack_5130.m_other = (double)local_63d0;
    local_5118.m_value = 0x20;
    local_5100.m_other = (double)(local_a80 + 0x100);
    local_5110.m_value = 1;
    local_5108.m_value = 0x60;
    local_50e8 = 0.0;
    local_50e0.m_other = 1.97626258336499e-323;
    local_50d8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x60;
    local_50c0.m_value = (long)pMVar3;
    local_50a8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x20;
    local_5090 = local_a80 + 0x400;
    local_50a0.m_other = 9.88131291682493e-324;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5078 = 0.0;
    local_5070 = (XprTypeNested)0x5;
    local_5068.m_value = 0x60;
    *local_5fb8 = 0.0;
    local_5fb8[1] = 0.0;
    local_5028 = (PointerType)0x60;
    local_5008.m_value = 0x20;
    local_5000 = 1.48219693752374e-323;
    local_4fb0.m_value = (long)(local_a80 + 0x200);
    local_4ff8 = 4.74303020007597e-322;
    local_4fe0 = local_63c8;
    local_4fc8 = 0.0;
    local_4fc0 = (XprTypeNested)0x1;
    local_4fb8.m_value = 0x60;
    local_4f40 = local_a80 + 0x500;
    local_4f98 = 1.58101006669199e-322;
    local_4f90 = 1.97626258336499e-323;
    local_4f88 = 4.74303020007597e-322;
    local_4f70 = (Matrix<double,__1,__1,_1,__1,__1> *)local_63c0;
    local_4f58 = 0.0;
    local_4f50 = 9.88131291682493e-324;
    local_4f48 = 4.74303020007597e-322;
    local_6200._0_8_ = local_5f80;
    local_4f28 = 1.58101006669199e-322;
    local_4f20 = 2.47032822920623e-323;
    local_4f18 = 4.74303020007597e-322;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5050 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5040 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5020 = local_c80 + 0x100;
    local_5010.m_value = (long)local_1580;
    local_4fd0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4fa0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4f60 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_4f30 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)local_6200,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    _auStack_51a0 =
         ZEXT824((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580);
    sStack_5188.m_other = 4.74303020007597e-322;
    pDStack_5180 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    *)local_6408;
    local_5168.m_value = 0x20;
    sStack_5160.m_other = 0.0;
    local_5158 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5148 = local_63c8;
    sStack_5130.m_other = 0.0;
    peStack_5128 = (element_type *)0x1;
    local_5120 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_5118.m_value = (long)local_63d0;
    local_5100.m_other = 1.58101006669199e-322;
    local_50f8 = (RhsNested)0x1;
    local_50f0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50d8 = (Matrix<double,__1,__1,_1,__1,__1> *)ppCVar8;
    local_50c0.m_value = 0;
    local_50b8.m_value = 2;
    local_50b0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    local_50a8 = local_6418;
    local_5090 = (undefined1 *)0x20;
    local_5088.m_other = 9.88131291682493e-324;
    local_5080 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)0x60;
    sStack_51b0.m_other = (double)local_1580;
    vStack_5170.m_value = (long)local_1580;
    sStack_5138.m_other = (double)local_1580;
    local_5108.m_value = (long)local_1580;
    local_50c8 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    local_5098 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_1580;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_54c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_51c0,local_63e8,(StorageBaseType *)local_5f80);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_54c0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_51c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_6200,
               local_6420,local_6428,0);
    local_1fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_54c0;
    auStack_51a0._8_8_ = peStack_61d8;
    auStack_51a0._0_8_ = vStack_61e0.m_value;
    local_51c0._8_8_ = local_6200._8_8_;
    local_51c0._0_8_ = local_6200._0_8_;
    sStack_51b0.m_other = (double)LStack_61f0.m_matrix;
    vStack_51a8.m_value = vStack_61e8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)&local_1fc0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_20c0,(double *)&local_6320,(StorageBaseType *)local_5c40);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_55c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)local_5a00);
    local_21c0._24_8_ =
         local_20c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[2];
    local_21a0.m_other =
         local_20c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[3];
    local_2180 = (RhsNested)
                 local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    local_2178.m_other =
         local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[3];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5d20,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)local_5b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_21c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5d20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5de8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)local_5800);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5700,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_5900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5de8);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_6020,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)local_53c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_5700,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6020);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_63b0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)local_54c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_63b0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_1fc0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_55c0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)local_5c40);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5d20,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)local_5a00);
    local_20c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[2];
    local_20c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[3];
    local_20c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = sStack_5d10.m_other;
    local_20c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = (double)vStack_5d08.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5de8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)local_5b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_21c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_20c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5de8);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_6020,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)local_5800);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_21c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6020);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_63b0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)local_53c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_5900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_63b0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5d50,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)local_54c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5d50);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_5700,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5d20,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)local_5c40);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5de8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)local_5a00);
    local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = sStack_5d10.m_other;
    local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_5d08.m_value;
    local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = sStack_5dd8.m_other;
    local_55c0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = (double)vStack_5dd0.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_6020,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)local_5b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_20c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_55c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6020);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_63b0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)local_5800);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_21c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_20c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_63b0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5d50,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)local_53c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_21c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5d50);
    Eigen::operator*(&local_5b28,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)local_54c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5b28);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_5900,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5de8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x12,(StorageBaseType *)local_5c40);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_6020,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)local_5a00);
    vStack_5d08.m_value = (long)sStack_5dd8.m_other;
    sStack_5d00.m_other = (double)vStack_5dd0.m_value;
    peStack_5ce0 = (element_type *)sStack_6010.m_other;
    local_5cd8.m_other = (double)vStack_6008.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_63b0,local_5fa8,(StorageBaseType *)local_5b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_55c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5d20,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_63b0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5d50,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)local_5800);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_20c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_55c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5d50);
    Eigen::operator*(&local_5b28,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)local_53c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_20c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5b28);
    Eigen::operator*(&local_55e8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)local_54c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_55e8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_21c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_6020,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)local_5c40);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_63b0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)local_5a00);
    vStack_5dd0.m_value = (long)sStack_6010.m_other;
    sStack_5dc8.m_other = (double)vStack_6008.m_value;
    local_5da8 = (element_type *)
                 local_63b0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                 .m_xpr;
    local_5da0.m_other =
         (double)local_63b0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                 .m_startRow.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5d50,local_5fb0,(StorageBaseType *)local_5b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5d20,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5de8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5d50);
    Eigen::operator*(&local_5b28,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)local_5800);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_55c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5d20,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5b28);
    Eigen::operator*(&local_55e8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)local_53c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_55c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_55e8);
    Eigen::operator*(&local_51e8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)local_54c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_51e8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_20c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_51c0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_63b0,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)local_5c40);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5d50,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)local_5a00);
    vStack_6008.m_value =
         (long)local_63b0.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
               m_xpr;
    vStack_6000.m_value =
         local_63b0.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
         m_startRow.m_value;
    local_5fe0 = (double)local_5d50.
                         super_BlockImpl<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false,_true>
                         .m_xpr;
    local_5fd8 = (RhsNested)
                 local_5d50.
                 super_BlockImpl<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false,_true>
                 .m_startRow.m_value;
    Eigen::operator*(&local_5b28,local_5fc0,(StorageBaseType *)local_5b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5de8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_6020,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5b28);
    Eigen::operator*(&local_55e8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)local_5800);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5d20,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5de8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_55e8);
    Eigen::operator*(&local_51e8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)local_53c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5d20,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_51e8);
    Eigen::operator*(&local_1ea8,
                     local_6320.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)local_54c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_6200,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1ea8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_55c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_51c0);
    lVar21 = 0;
    while( true ) {
      if (lVar21 == 0x10) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5de8,xpr,
                 lVar21,startCol);
      peStack_5200 = (element_type *)sStack_5dc8.m_other;
      peStack_51f8 = peStack_5dc0;
      pDStack_5220 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_5de8._0_8_;
      pDStack_5218 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_5de8._8_8_;
      local_5210 = (element_type *)sStack_5dd8.m_other;
      peStack_5208 = (element_type *)vStack_5dd0.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6020,xpr,
                 lVar21,lVar18);
      sStack_5d00.m_other = (double)vStack_6000.m_value;
      sStack_5cf8.m_other = (double)peStack_5ff8;
      local_5d20._0_8_ = local_6020._0_8_;
      local_5d20._8_8_ = local_6020._8_8_;
      sStack_5d10.m_other = sStack_6010.m_other;
      vStack_5d08.m_value = vStack_6008.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                (&local_63b0,xpr,lVar21,lVar20);
      peStack_61c0 = peStack_51f8;
      vStack_61c8.m_value = (long)peStack_5200;
      local_61b0.m_matrix = &local_55c0;
      local_6168.m_matrix = &local_20c0;
      local_6368[2] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_6368[3] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      local_6368[4] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startCol.m_value;
      local_6368[5] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_outerStride;
      sStack_61d0.m_other = (double)peStack_5208;
      peStack_61d8 = local_5210;
      vStack_61e0.m_value = (long)pDStack_5218;
      vStack_61e8.m_value = (long)pDStack_5220;
      *local_6368 = local_63b0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>
                    .m_data;
      local_6368[1] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>.
           _8_8_;
      local_6368[2] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_6368[3] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      LStack_61f0.m_matrix = &local_1fc0;
      vStack_6188.m_value = (long)sStack_5d00.m_other;
      sStack_6180.m_other = sStack_5cf8.m_other;
      sStack_61a8.m_other = (double)local_5d20._0_8_;
      peStack_61a0 = (element_type *)local_5d20._8_8_;
      peStack_6198 = (element_type *)sStack_5d10.m_other;
      vStack_6190.m_value = vStack_5d08.m_value;
      Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false>::Block
                (&local_5d50,(Matrix<double,_16,_96,_1,_16,_96> *)local_51c0,lVar21,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,16,96,1,16,96>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>>
                (&local_5d50,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>
                  *)local_6200);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5de8,xpr,
                 lVar21,startCol);
      peStack_5240 = (element_type *)sStack_5dc8.m_other;
      peStack_5238 = peStack_5dc0;
      pDStack_5260 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_5de8._0_8_;
      pDStack_5258 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_5de8._8_8_;
      local_5250 = (element_type *)sStack_5dd8.m_other;
      peStack_5248 = (element_type *)vStack_5dd0.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6020,xpr,
                 lVar21,lVar18);
      sStack_5d00.m_other = (double)vStack_6000.m_value;
      sStack_5cf8.m_other = (double)peStack_5ff8;
      local_5d20._0_8_ = local_6020._0_8_;
      local_5d20._8_8_ = local_6020._8_8_;
      sStack_5d10.m_other = sStack_6010.m_other;
      vStack_5d08.m_value = vStack_6008.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                (&local_63b0,xpr,lVar21,lVar20);
      peStack_61c0 = peStack_5238;
      vStack_61c8.m_value = (long)peStack_5240;
      local_61b0.m_matrix = &local_5700;
      local_6368[2] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_6368[3] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      local_6368[4] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startCol.m_value;
      local_6368[5] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_outerStride;
      sStack_61d0.m_other = (double)peStack_5248;
      peStack_61d8 = local_5250;
      vStack_61e0.m_value = (long)pDStack_5258;
      vStack_61e8.m_value = (long)pDStack_5260;
      *local_6368 = local_63b0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>
                    .m_data;
      local_6368[1] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>.
           _8_8_;
      local_6368[2] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_6368[3] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      LStack_61f0.m_matrix = &local_55c0;
      local_6168.m_matrix = (non_const_type)local_21c0;
      vStack_6188.m_value = (long)sStack_5d00.m_other;
      sStack_6180.m_other = sStack_5cf8.m_other;
      sStack_61a8.m_other = (double)local_5d20._0_8_;
      peStack_61a0 = (element_type *)local_5d20._8_8_;
      peStack_6198 = (element_type *)sStack_5d10.m_other;
      vStack_6190.m_value = vStack_5d08.m_value;
      Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false>::Block
                (&local_5d50,(Matrix<double,_16,_96,_1,_16,_96> *)local_51c0,lVar21,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,16,96,1,16,96>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>>
                (&local_5d50,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>
                  *)local_6200);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5de8,xpr,
                 lVar21,startCol);
      peStack_5280 = (element_type *)sStack_5dc8.m_other;
      peStack_5278 = peStack_5dc0;
      pDStack_52a0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_5de8._0_8_;
      pDStack_5298 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      *)local_5de8._8_8_;
      local_5290 = (element_type *)sStack_5dd8.m_other;
      peStack_5288 = (element_type *)vStack_5dd0.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_6020,xpr,
                 lVar21,lVar18);
      sStack_5d00.m_other = (double)vStack_6000.m_value;
      sStack_5cf8.m_other = (double)peStack_5ff8;
      local_5d20._0_8_ = local_6020._0_8_;
      local_5d20._8_8_ = local_6020._8_8_;
      sStack_5d10.m_other = sStack_6010.m_other;
      vStack_5d08.m_value = vStack_6008.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                (&local_63b0,xpr,lVar21,lVar20);
      peStack_61c0 = peStack_5278;
      vStack_61c8.m_value = (long)peStack_5280;
      local_61b0.m_matrix = (non_const_type)local_21c0;
      local_6368[2] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_6368[3] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      local_6368[4] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startCol.m_value;
      local_6368[5] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_outerStride;
      sStack_61d0.m_other = (double)peStack_5288;
      peStack_61d8 = local_5290;
      vStack_61e0.m_value = (long)pDStack_5298;
      vStack_61e8.m_value = (long)pDStack_52a0;
      *local_6368 = local_63b0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>
                    .m_data;
      local_6368[1] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>.
           _8_8_;
      local_6368[2] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_6368[3] =
           local_63b0.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      LStack_61f0.m_matrix = &local_20c0;
      local_6168.m_matrix = &local_5900;
      vStack_6188.m_value = (long)sStack_5d00.m_other;
      sStack_6180.m_other = sStack_5cf8.m_other;
      sStack_61a8.m_other = (double)local_5d20._0_8_;
      peStack_61a0 = (element_type *)local_5d20._8_8_;
      peStack_6198 = (element_type *)sStack_5d10.m_other;
      vStack_6190.m_value = vStack_5d08.m_value;
      Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false>::Block
                (&local_5d50,(Matrix<double,_16,_96,_1,_16,_96> *)local_51c0,lVar21,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,16,96,1,16,96>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>>
                (&local_5d50,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>
                  *)local_6200);
      lVar21 = lVar21 + 1;
    }
    local_5f90 = 2;
    for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
      local_6428 = lVar21 * 3 + 1;
      local_6430 = (double)(lVar21 * 3 + 2);
      lVar20 = 0;
      lVar18 = local_5f90;
      while( true ) {
        if (lVar18 == 0x32) break;
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_96,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_96,_false> *)local_5de8,
                   local_5f88,lVar21,startCol);
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_96,_1,_1,_96>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_96,_false>_>
                          *)local_5d20,&local_6328,(StorageBaseType *)local_5de8);
        Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_96,_false>::Block
                  ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_96,_false> *)local_6020,
                   (Matrix<double,_16,_96,_1,_16,_96> *)local_51c0,lVar21 + lVar20,0);
        vStack_6190.m_value = vStack_6000.m_value;
        vStack_6188.m_value = (long)peStack_5ff8;
        local_61b0.m_matrix = (non_const_type)local_6020._0_8_;
        sStack_61a8.m_other = (double)local_6020._8_8_;
        peStack_61a0 = (element_type *)sStack_6010.m_other;
        peStack_6198 = (element_type *)vStack_6008.m_value;
        LStack_61f0.m_matrix = (non_const_type)sStack_5d10.m_other;
        vStack_61c8.m_value = vStack_5ce8.m_value;
        peStack_61c0 = peStack_5ce0;
        vStack_61e8.m_value = vStack_5d08.m_value;
        vStack_61e0.m_value = (long)sStack_5d00.m_other;
        peStack_61d8 = (element_type *)sStack_5cf8.m_other;
        sStack_61d0.m_other = (double)vStack_5cf0.m_value;
        SVar24 = Eigen::internal::dense_product_base::operator_cast_to_double
                           ((dense_product_base *)local_6200);
        peVar23 = local_63b8;
        pSVar19 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)local_63b8,lVar21 * 3,lVar18 + -2);
        *pSVar19 = SVar24 + *pSVar19;
        pSVar19 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)peVar23,local_6428,lVar18 + -1);
        *pSVar19 = SVar24 + *pSVar19;
        pSVar19 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)peVar23,(Index)local_6430,lVar18);
        peVar23 = local_63b8;
        *pSVar19 = SVar24 + *pSVar19;
        if (lVar20 != 0) {
          pSVar19 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  *)local_63b8,lVar18 + -2,lVar21 * 3);
          *pSVar19 = SVar24 + *pSVar19;
          pSVar19 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  *)peVar23,lVar18 + -1,local_6428);
          *pSVar19 = SVar24 + *pSVar19;
          pSVar19 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  *)peVar23,lVar18,(Index)local_6430);
          *pSVar19 = SVar24 + *pSVar19;
        }
        lVar18 = lVar18 + 3;
        lVar20 = lVar20 + 1;
      }
      local_5f90 = local_5f90 + 3;
      xpr = local_5f88;
    }
    Eigen::internal::handmade_aligned_free(local_6380.m_storage.m_data);
    Eigen::internal::handmade_aligned_free(local_6450.m_storage.m_data);
    Eigen::internal::handmade_aligned_free(local_6400.m_storage.m_data);
    lVar21 = local_5f98 + 1;
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianContIntDamping(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For a small number of layers this method can be more efficient than the
    // "Pre-Integration" style calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 1 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
        // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
        // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
        // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
        // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
        // indices of the components are in transposed order
        //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
        // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
        //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                                   (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
        // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
        // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
        // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
        // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
        // same time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}